

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::RangeStaticLayerParams::MergePartialFromCodedStream
          (RangeStaticLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  ulong uVar9;
  float fVar10;
  float local_3c;
  float local_38;
  float local_34;
  
LAB_0013b7d6:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013b7f9;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013b7f9:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) != 0) {
      uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
      cVar8 = (char)uVar9;
      if (uVar6 == 3) {
        if (cVar8 == '\x1d') {
          pfVar3 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
            bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_34);
            fVar10 = local_34;
            if (!bVar7) {
              return false;
            }
          }
          else {
            fVar10 = *pfVar3;
            input->buffer_ = (uint8 *)(pfVar3 + 1);
          }
          this->stepsizevalue_ = fVar10;
          goto LAB_0013b7d6;
        }
      }
      else if (uVar6 == 2) {
        if (cVar8 == '\x15') {
          pfVar3 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
            bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_38);
            fVar10 = local_38;
            if (!bVar7) {
              return false;
            }
          }
          else {
            fVar10 = *pfVar3;
            input->buffer_ = (uint8 *)(pfVar3 + 1);
          }
          this->startvalue_ = fVar10;
          goto LAB_0013b7d6;
        }
      }
      else if ((uVar6 == 1) && (cVar8 == '\r')) {
        pfVar3 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
          bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_3c);
          fVar10 = local_3c;
          if (!bVar7) {
            return false;
          }
        }
        else {
          fVar10 = *pfVar3;
          input->buffer_ = (uint8 *)(pfVar3 + 1);
        }
        this->endvalue_ = fVar10;
        goto LAB_0013b7d6;
      }
    }
    bVar7 = (uVar5 & 7) == 4 || uVar5 == 0;
    if (bVar7) {
      return bVar7;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    if (!bVar4) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool RangeStaticLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.RangeStaticLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float endValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &endvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float startValue = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &startvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float stepSizeValue = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &stepsizevalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.RangeStaticLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.RangeStaticLayerParams)
  return false;
#undef DO_
}